

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e ktxPrintInfoForStream(ktxStream *stream)

{
  int iVar1;
  ktx_error_code_e kVar2;
  undefined8 *in_RDI;
  ktx_error_code_e result;
  anon_union_80_2_131c2913 header;
  ktx_uint8_t ktx2_ident_ref [12];
  ktx_uint8_t ktx_ident_ref [12];
  anon_enum_32 fileType;
  ktx_error_code_e local_84;
  undefined1 local_80 [12];
  undefined1 auStackY_74 [28];
  KTX_header *in_stack_ffffffffffffffa8;
  ktxStream *in_stack_ffffffffffffffb0;
  undefined8 local_2c;
  undefined4 local_24;
  KTX_header2 *pHeader;
  undefined4 uVar3;
  
  pHeader = (KTX_header2 *)0xbb31312058544bab;
  uVar3 = 0xa1a0a0d;
  local_2c = 0xbb30322058544bab;
  local_24 = 0xa1a0a0d;
  if (in_RDI == (undefined8 *)0x0) {
    __assert_fail("stream != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0x41e,"ktx_error_code_e ktxPrintInfoForStream(ktxStream *)");
  }
  local_84 = (*(code *)*in_RDI)(in_RDI,local_80,0xc);
  if (local_84 == KTX_SUCCESS) {
    iVar1 = memcmp(local_80,&stack0xffffffffffffffe0,0xc);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = memcmp(local_80,&local_2c,0xc);
      if (iVar1 != 0) {
        return KTX_UNKNOWN_FILE_FORMAT;
      }
      iVar1 = 1;
    }
    if (iVar1 == 0) {
      local_84 = (*(code *)*in_RDI)(in_RDI,auStackY_74,0x34);
      printKTXInfo2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      kVar2 = (*(code *)*in_RDI)(in_RDI,auStackY_74,0x44);
      if (kVar2 != KTX_SUCCESS) {
        return kVar2;
      }
      local_84 = printKTX2Info2((ktxStream *)CONCAT44(iVar1,uVar3),pHeader);
    }
  }
  return local_84;
}

Assistant:

KTX_error_code
ktxPrintInfoForStream(ktxStream* stream)
{
    enum { KTX, KTX2 } fileType;
    ktx_uint8_t ktx_ident_ref[12] = KTX_IDENTIFIER_REF;
    ktx_uint8_t ktx2_ident_ref[12] = KTX2_IDENTIFIER_REF;
    union {
        KTX_header ktx;
        KTX_header2 ktx2;
    } header;
    KTX_error_code result;

    assert(stream != NULL);

    result = stream->read(stream, &header, sizeof(ktx2_ident_ref));
    if (result == KTX_SUCCESS) {
        // Compare identifier, is this a KTX  or KTX2 file?
        if (!memcmp(header.ktx.identifier, ktx_ident_ref, 12)) {
                fileType = KTX;
        } else if (!memcmp(header.ktx2.identifier, ktx2_ident_ref, 12)) {
                fileType = KTX2;
        } else {
                return KTX_UNKNOWN_FILE_FORMAT;
        }
        if (fileType == KTX) {
            // Read rest of header.
            result = stream->read(stream, &header.ktx.endianness,
                                  KTX_HEADER_SIZE - sizeof(ktx_ident_ref));
            printKTXInfo2(stream, &header.ktx);
        } else {
            // Read rest of header.
            result = stream->read(stream, &header.ktx2.vkFormat,
                                 KTX2_HEADER_SIZE - sizeof(ktx2_ident_ref));
            if (result != KTX_SUCCESS)
                return result;
            result = printKTX2Info2(stream, &header.ktx2);
        }
    }
    return result;
}